

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
::try_emplace_impl<google::protobuf::OneofDescriptor_const*const&>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,OneofDescriptor **k)

{
  tuple<> local_21;
  tuple<const_google::protobuf::OneofDescriptor_*const_&> local_20;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
  ::find_or_prepare_insert<google::protobuf::OneofDescriptor_const*>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.super__Tuple_impl<0UL,_const_google::protobuf::OneofDescriptor_*const_&>.
    super__Head_base<0UL,_const_google::protobuf::OneofDescriptor_*const_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_google::protobuf::OneofDescriptor_*const_&>)
         (_Tuple_impl<0UL,_const_google::protobuf::OneofDescriptor_*const_&>)k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::OneofDescriptor_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }